

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

ssize_t __thiscall kj::FdOutputStream::write(FdOutputStream *this,int __fd,void *__buf,size_t __n)

{
  int code;
  void *pvVar1;
  char *pcVar2;
  undefined4 in_register_00000034;
  Fault local_78;
  Fault f_1;
  Fault local_60;
  Fault f;
  SyscallResult local_34;
  undefined1 auStack_30 [4];
  SyscallResult _kjSyscallResult;
  ssize_t n;
  char *pos;
  size_t size_local;
  void *buffer_local;
  FdOutputStream *this_local;
  
  pcVar2 = (char *)CONCAT44(in_register_00000034,__fd);
  pos = (char *)__buf;
  while( true ) {
    if (pos == (char *)0x0) {
      return (ssize_t)pcVar2;
    }
    f.exception = (Exception *)auStack_30;
    local_34 = _::Debug::syscall<kj::FdOutputStream::write(void_const*,unsigned_long)::__0>
                         ((anon_class_32_4_c03b49cc *)&f,false);
    pvVar1 = _::Debug::SyscallResult::operator_cast_to_void_(&local_34);
    if (pvVar1 == (void *)0x0) break;
    if ((long)_auStack_30 < 1) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
                (&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                 ,0x16f,FAILED,"n > 0","\"write() returned zero.\"",
                 (char (*) [23])"write() returned zero.");
      _::Debug::Fault::fatal(&local_78);
    }
    pcVar2 = pos + -(long)_auStack_30;
    pos = pcVar2;
  }
  code = _::Debug::SyscallResult::getErrorNumber(&local_34);
  _::Debug::Fault::Fault<int,int&>
            (&local_60,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
             ,0x16e,code,"n = miniposix::write(fd, pos, size)","fd",&this->fd);
  _::Debug::Fault::fatal(&local_60);
}

Assistant:

void FdOutputStream::write(const void* buffer, size_t size) {
  const char* pos = reinterpret_cast<const char*>(buffer);

  while (size > 0) {
    miniposix::ssize_t n;
    KJ_SYSCALL(n = miniposix::write(fd, pos, size), fd);
    KJ_ASSERT(n > 0, "write() returned zero.");
    pos += n;
    size -= n;
  }
}